

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O0

int shm::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TemplateSHMException<0> *pTVar2;
  ostream *poVar3;
  ulong uVar4;
  size_t __len;
  char *pcVar5;
  TemplateSHMException<1> *this;
  void *pvVar6;
  int *piVar7;
  void *in_RCX;
  byte in_DL;
  ulong in_RSI;
  float fVar8;
  double dVar9;
  float local_9ec;
  char *temp;
  string local_998 [32];
  stringstream local_978 [8];
  stringstream ss_2;
  ostream local_968 [383];
  undefined1 local_7e9;
  string local_7e8 [32];
  stringstream local_7c8 [8];
  stringstream ss_1;
  ostream local_7b8 [376];
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  mode_t mode;
  int32_t flags;
  stringstream local_610 [8];
  stringstream ss;
  ostream local_600 [376];
  string local_488 [32];
  stringstream local_468 [8];
  stringstream path;
  ostream local_458 [376];
  undefined1 local_2e0 [8];
  stat st;
  int fd;
  size_t alloc_bytes;
  string local_238 [32];
  stringstream local_218 [8];
  stringstream errstr;
  ostream local_208 [376];
  ulong local_90;
  long total_possible_bytes;
  long page_size;
  long num_phys_pages;
  void *out;
  allocator local_59;
  string local_58 [39];
  anon_class_1_0_00000001 local_31;
  void *pvStack_30;
  anon_class_1_0_00000001 handle_open_failure;
  void *ptr_local;
  bool zero_local;
  size_t nbytes_local;
  shm_key_t *key_local;
  
  if (in_RSI == 0) {
    out._3_1_ = 1;
    pTVar2 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"nbytes cannot be zero when allocating memory!",&local_59)
    ;
    TemplateSHMException<0>::TemplateSHMException(pTVar2,(string *)local_58);
    out._3_1_ = 0;
    __cxa_throw(pTVar2,&TemplateSHMException<0>::typeinfo,
                TemplateSHMException<0>::~TemplateSHMException);
  }
  num_phys_pages = 0;
  pvStack_30 = in_RCX;
  page_size = sysconf(0x55);
  total_possible_bytes = sysconf(0x1e);
  local_90 = page_size * total_possible_bytes;
  if (local_90 < in_RSI) {
    std::__cxx11::stringstream::stringstream(local_218);
    poVar3 = std::operator<<(local_208,"You\'ve tried to allocate too many bytes (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI);
    poVar3 = std::operator<<(poVar3,"),");
    poVar3 = std::operator<<(poVar3," the total possible is (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_90);
    std::operator<<(poVar3,")\n");
    pTVar2 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    TemplateSHMException<0>::TemplateSHMException(pTVar2,local_238);
    __cxa_throw(pTVar2,&TemplateSHMException<0>::typeinfo,
                TemplateSHMException<0>::~TemplateSHMException);
  }
  local_9ec = (float)in_RSI;
  dVar9 = std::ceil((double)(ulong)(uint)(local_9ec / (float)total_possible_bytes));
  fVar8 = SUB84(dVar9,0) + 1.0;
  uVar4 = (ulong)fVar8;
  __len = (uVar4 | (long)(fVar8 - 9.223372e+18) & (long)uVar4 >> 0x3f) * total_possible_bytes;
  st.__glibc_reserved[2]._4_4_ = 0xffffffff;
  std::__cxx11::stringstream::stringstream(local_468);
  poVar3 = std::operator<<(local_458,"/dev/shm/");
  std::operator<<(poVar3,(char *)ctx);
  std::__cxx11::stringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar5,(stat *)local_2e0);
  std::__cxx11::string::~string(local_488);
  if (iVar1 == 0) {
    std::__cxx11::stringstream::stringstream(local_610);
    poVar3 = std::operator<<(local_600,"SHM Handle already exists \"");
    poVar3 = std::operator<<(poVar3,(char *)ctx);
    std::operator<<(poVar3,"\" already exists, please use open\n");
    mode._3_1_ = 1;
    this = (TemplateSHMException<1> *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    TemplateSHMException<1>::TemplateSHMException(this,(string *)&flags);
    mode._3_1_ = 0;
    __cxa_throw(this,&TemplateSHMException<1>::typeinfo,
                TemplateSHMException<1>::~TemplateSHMException);
  }
  local_638 = 0xc2;
  local_63c = 0x180;
  st.__glibc_reserved[2]._4_4_ = shm_open((char *)ctx,0xc2,0x180);
  if (st.__glibc_reserved[2]._4_4_ == -1) {
    pvVar6 = init::anon_class_1_0_00000001::operator()(&local_31,(shm_key_t *)ctx);
    key_local._0_4_ = (int)pvVar6;
  }
  else {
    iVar1 = ftruncate(st.__glibc_reserved[2]._4_4_,__len);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream(local_7c8);
      poVar3 = std::operator<<(local_7b8,"Failed to truncate shm for file descriptor (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,st.__glibc_reserved[2]._4_4_);
      std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(local_7b8,"with number of bytes (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI);
      std::operator<<(poVar3,").  Error code returned: ");
      piVar7 = __errno_location();
      pcVar5 = strerror(*piVar7);
      std::operator<<(local_7b8,pcVar5);
      shm_unlink((char *)ctx);
      local_7e9 = 1;
      pTVar2 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      TemplateSHMException<0>::TemplateSHMException(pTVar2,local_7e8);
      local_7e9 = 0;
      __cxa_throw(pTVar2,&TemplateSHMException<0>::typeinfo,
                  TemplateSHMException<0>::~TemplateSHMException);
    }
    num_phys_pages = (long)mmap(pvStack_30,__len,3,1,st.__glibc_reserved[2]._4_4_,0);
    if ((void *)num_phys_pages == (void *)0xffffffffffffffff) {
      std::__cxx11::stringstream::stringstream(local_978);
      poVar3 = std::operator<<(local_968,"Failed to mmap shm region with the following error: ");
      piVar7 = __errno_location();
      pcVar5 = strerror(*piVar7);
      poVar3 = std::operator<<(poVar3,pcVar5);
      poVar3 = std::operator<<(poVar3,",\n");
      std::operator<<(poVar3,"unlinking.");
      shm_unlink((char *)ctx);
      pTVar2 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      TemplateSHMException<0>::TemplateSHMException(pTVar2,local_998);
      __cxa_throw(pTVar2,&TemplateSHMException<0>::typeinfo,
                  TemplateSHMException<0>::~TemplateSHMException);
    }
    if ((in_DL & 1) != 0) {
      memset((void *)num_phys_pages,0,in_RSI);
    }
    mprotect((void *)(num_phys_pages + (__len - total_possible_bytes)),total_possible_bytes,0);
    key_local._0_4_ = (int)num_phys_pages;
  }
  local_640 = 1;
  std::__cxx11::stringstream::~stringstream(local_468);
  return (int)key_local;
}

Assistant:

void*
shm::init( const shm_key_t     &key,
           const std::size_t   nbytes,
           const bool zero   /* zero mem */,
           void   *ptr )
{
    auto handle_open_failure = [&]( const shm_key_t &key ) -> void*
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
#endif
        if( errno == EEXIST )
        {
#if USE_CPP_EXCEPTIONS==1      
            ss << "SHM Handle already exists \"" << key << "\" already exists, please use open\n";
            throw shm_already_exists( ss.str() );
#else            
            return( (void*)-1 );
#endif            
        }
        else 
        {
#if USE_CPP_EXCEPTIONS==1      
            ss << "Failed to open shm with file descriptor \"" << 
               key << "\", error code returned: ";
            ss << std::strerror( errno );
            throw bad_shm_alloc( ss.str() ); 
#else
            return( nullptr );
#endif
        }
    };

    if( nbytes == 0 )
    {
#if USE_CPP_EXCEPTIONS==1      
       throw bad_shm_alloc( "nbytes cannot be zero when allocating memory!" );
#else
        return( nullptr );
#endif
    }
    
    /** 
     * NOTE: 
     * - actual allocation size should be alloc_bytes,
     * user has no idea so we'll re-calc this at the  end
     * when we unmap the data.
     * - This is the same out that is returned at the end
     * for ease of keeping track of code between the two
     * different versions. 
     */
    void *out( nullptr );
    

    /**
     * NOTE: this is largely for truncation purposes,
     * but this is also needed as a sanity check and 
     * some off the values are needed elsewhere so let's
     * do this before we go into POSIX/SystemV specific 
     * code. 
     */
    const auto num_phys_pages( sysconf( _SC_PHYS_PAGES ) );
    const auto page_size( sysconf( _SC_PAGE_SIZE ) );
    const auto total_possible_bytes( num_phys_pages * page_size );
    if( nbytes > total_possible_bytes )
    {
    
#if USE_CPP_EXCEPTIONS==1      
         std::stringstream errstr;
         errstr << "You've tried to allocate too many bytes (" << nbytes << "),"
             << " the total possible is (" << total_possible_bytes << ")\n";
         throw bad_shm_alloc( errstr.str() ); 
#else
         //errno should be set (hopefully)
         return( nullptr );
#endif
    }
    /** get allocations size including extra dummy page **/
    const auto alloc_bytes( 
       static_cast< std::size_t >( 
          std::ceil(  
             static_cast< float >( nbytes) / 
            static_cast< float >( page_size ) ) + 1 /** one extra page for guard **/ ) * page_size 
    );
    
#if _USE_POSIX_SHM_ == 1
    int fd( shm::failure  );
    //stupid hack to get around platforms that are
    //using LD_PRELOAD, e.g., dynamic binary tools
    struct stat st;
    std::stringstream path;
    path << "/dev/shm/" << key;
    if( stat( path.str().c_str(), &st ) == 0 )
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
#endif
#if USE_CPP_EXCEPTIONS==1      
            ss << "SHM Handle already exists \"" << key << "\" already exists, please use open\n";
            throw shm_already_exists( ss.str() );
#else            
            return( (void*)-1 );
#endif            
    }
    
    /* set read/write set create if not exists */
    const std::int32_t flags( O_RDWR | O_CREAT | O_EXCL );
    /* set read/write by user */
    const mode_t mode( S_IWUSR | S_IRUSR );
    fd  = shm_open( key, 
                    flags, 
                    mode );
    if( fd == failure )
    {
        //if using exceptions you won't return
        return( handle_open_failure( key ) );
    }
    
    if( ftruncate( fd, alloc_bytes ) != shm::success )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to truncate shm for file descriptor (" << fd << ") ";
       ss << "with number of bytes (" << nbytes << ").  Error code returned: ";
       ss << std::strerror( errno );
       shm_unlink( key );
       throw bad_shm_alloc( ss.str() );
#else
       shm_unlink( key );
       return( nullptr );
#endif
    }

    /** 
     * NOTE: might be useful to change page size to something larger than default
     * for some applications. We'll add that as a future option, however, for now
     * I'll leave the note here.
     * flags = MAP_HUGETLB | MAP_ANONYMOUS | MAP_HUGE_2MB
     * flags = MAP_HUGETLB | MAP_ANONYMOUS | MAP_HUGE_1GB
     * we'll need to make sure huge pages are installed/enabled first
     * for ubuntu + apt:
     * apt-get install hugepages
     * you'll need to set it up, some good info if you don't know what you're 
     * doing is here: https://kerneltalks.com/services/what-is-huge-pages-in-linux/
     * you'll likely need to reboot to clear out any funky kernel states, once you're done,
     * write a test program and make sure that you're allocating, the command:
     * hugeadm --explain 
     * should tell you what's set up and in use.
     */
    out = mmap( ptr, 
                alloc_bytes, 
                ( PROT_READ | PROT_WRITE ), 
                MAP_SHARED, 
                fd, 
                0 );
    if( out == MAP_FAILED )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to mmap shm region with the following error: " << 
         std::strerror( errno ) << ",\n" << "unlinking.";
       shm_unlink( key );
       throw bad_shm_alloc( ss.str() );
#else
       shm_unlink( key );
       return( nullptr );
#endif
    }
/**
 * ###### END POSIX SECTION ######
 */
#elif _USE_SYSTEMV_SHM_ == 1
/**
 * ###### START SYSTEM-V SECTION  ######
 */
    /** first time you try to open it **/
    const auto shmid = 
        shmget( key, alloc_bytes, IPC_CREAT | IPC_EXCL | S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP );
    if( shmid == shm::failure ) 
    {
        //if using exceptions, you won't return from this
        return( handle_open_failure( key ) );
    }

    out  = shmat( shmid, nullptr, 0 );
    if( out == (void*)-1 )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to mmap shm region with the following error: " << 
         std::strerror( errno ) << ",\n" << "unlinking.";
       throw bad_shm_alloc( ss.str() );
#else
       return( nullptr );
#endif
    }


#endif /** end switch between posix/sysV **/    
    if( zero )
    {
       /* everything theoretically went well, lets initialize to zero */
       std::memset( out, 0x0, nbytes );
    }
    char *temp( reinterpret_cast< char* >( out ) );
    /** we allocate one extra page **/
    if( mprotect( (void*) &temp[ alloc_bytes - page_size ],
                   page_size, 
                   PROT_NONE ) != 0 )
    {
#if DEBUG   
      perror( "Error, failed to set page protection, not fatal just dangerous." );
#endif      
   }
   return( out );
}